

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

void __thiscall CMU462::MeshResampler::resample(MeshResampler *this,HalfedgeMesh *mesh)

{
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *plVar1;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  Size SVar10;
  Size SVar11;
  Size SVar12;
  Size SVar13;
  _List_node_base *p_Var14;
  int iVar15;
  int iVar16;
  _List_node_base *p_Var17;
  int iVar18;
  int iVar20;
  int iVar21;
  Vertex *this_00;
  EdgeIter EVar22;
  int iVar23;
  int iVar24;
  _Self __tmp;
  EdgeIter EVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  Vector3D N;
  Vector3D c;
  double local_80;
  Vector3D local_60;
  double local_48;
  double dStack_40;
  double local_38;
  int iVar19;
  
  plVar1 = &mesh->edges;
  local_80 = 0.0;
  p_Var17 = (_List_node_base *)plVar1;
  while (p_Var17 = (((_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)&p_Var17->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var17 != (_List_node_base *)plVar1) {
    dVar4 = Edge::length((Edge *)(p_Var17 + 1));
    local_80 = local_80 + dVar4;
  }
  sVar3 = (mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
          _M_node._M_size;
  dVar4 = (local_80 /
          (((double)CONCAT44(0x45300000,(int)(sVar3 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) * 4.0;
  plVar2 = &mesh->vertices;
  for (iVar9 = 0; iVar9 != 5; iVar9 = iVar9 + 1) {
    iVar19 = (int)(mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
    EVar25._M_node = (_List_node_base *)plVar1;
    if (iVar19 < 1) {
      iVar19 = 0;
    }
    while (iVar18 = iVar19 + -1, iVar19 != 0) {
      EVar25._M_node = (EVar25._M_node)->_M_next;
      dVar5 = Edge::length((Edge *)(EVar25._M_node + 1));
      iVar19 = iVar18;
      if (dVar4 / 3.0 < dVar5) {
        HalfedgeMesh::splitEdge(mesh,EVar25);
      }
    }
    bVar26 = true;
    EVar25._M_node =
         (plVar1->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>)._M_impl._M_node.
         super__List_node_base._M_next;
    while (EVar22._M_node = (_List_node_base *)plVar1, bVar26) {
      dVar5 = Edge::length((Edge *)(EVar25._M_node + 1));
      if (dVar4 / 5.0 <= dVar5) {
        EVar22._M_node = (EVar25._M_node)->_M_next;
      }
      else {
        EVar22._M_node = EVar25._M_node;
        do {
          do {
            EVar22._M_node = (EVar22._M_node)->_M_next;
          } while (EVar22._M_node == EVar25._M_node[6]._M_prev[2]._M_next[2]._M_next[3]._M_next);
        } while (EVar22._M_node ==
                 EVar25._M_node[6]._M_prev[1]._M_prev[2]._M_next[2]._M_next[3]._M_next);
        HalfedgeMesh::collapseEdge(mesh,EVar25);
      }
      bVar26 = EVar22._M_node != (_List_node_base *)plVar1;
      EVar25._M_node = EVar22._M_node;
    }
    while (EVar22._M_node = (EVar22._M_node)->_M_next, p_Var17 = (_List_node_base *)plVar2,
          EVar22._M_node != (_List_node_base *)plVar1) {
      SVar10 = Vertex::degree((Vertex *)(EVar22._M_node[6]._M_prev[2]._M_prev + 1));
      SVar11 = Vertex::degree((Vertex *)(EVar22._M_node[6]._M_prev[1]._M_prev[2]._M_prev + 1));
      SVar12 = Vertex::degree((Vertex *)
                              (EVar22._M_node[6]._M_prev[2]._M_next[2]._M_next[2]._M_prev + 1));
      this_00 = (Vertex *)
                (EVar22._M_node[6]._M_prev[1]._M_prev[2]._M_next[2]._M_next[2]._M_prev + 1);
      SVar13 = Vertex::degree(this_00);
      iVar18 = (int)SVar10 + -6;
      iVar19 = -iVar18;
      if (0 < iVar18) {
        iVar19 = iVar18;
      }
      iVar15 = (int)SVar11 + -6;
      iVar18 = -iVar15;
      if (0 < iVar15) {
        iVar18 = iVar15;
      }
      iVar16 = (int)SVar12 + -6;
      iVar15 = -iVar16;
      if (0 < iVar16) {
        iVar15 = iVar16;
      }
      iVar21 = (int)SVar13 + -6;
      iVar16 = -iVar21;
      if (0 < iVar21) {
        iVar16 = iVar21;
      }
      iVar23 = (int)SVar10 + -7;
      iVar21 = -iVar23;
      if (0 < iVar23) {
        iVar21 = iVar23;
      }
      iVar20 = (int)SVar11 + -7;
      iVar23 = -iVar20;
      if (0 < iVar20) {
        iVar23 = iVar20;
      }
      iVar24 = (int)SVar12 + -5;
      iVar20 = -iVar24;
      if (0 < iVar24) {
        iVar20 = iVar24;
      }
      iVar8 = (int)SVar13 + -5;
      iVar24 = -iVar8;
      if (0 < iVar8) {
        iVar24 = iVar8;
      }
      if ((uint)(iVar24 + iVar20 + iVar23 + iVar21) < (uint)(iVar16 + iVar15 + iVar18 + iVar19)) {
        HalfedgeMesh::flipEdge((HalfedgeMesh *)this_00,EVar22);
      }
    }
    while (p_Var17 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                      &p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var14 = (_List_node_base *)plVar2, p_Var17 != (_List_node_base *)plVar2) {
      Vertex::normal(&local_60,(Vertex *)(p_Var17 + 1));
      (**(code **)p_Var17[1]._M_next)(&local_48,(Vertex *)(p_Var17 + 1));
      p_Var14 = p_Var17[2]._M_prev;
      dVar6 = (double)p_Var17[2]._M_next;
      dVar27 = local_48 - (double)p_Var17[1]._M_prev;
      dVar28 = dStack_40 - dVar6;
      dVar5 = local_38 - (double)p_Var14;
      dVar29 = local_60.z * dVar5 + local_60.x * dVar27 + dVar28 * local_60.y;
      p_Var17[4]._M_prev = (_List_node_base *)((dVar27 - dVar29) * 0.2 + (double)p_Var17[1]._M_prev)
      ;
      p_Var17[5]._M_next = (_List_node_base *)((dVar28 - dVar29) * 0.2 + dVar6);
      p_Var17[5]._M_prev = (_List_node_base *)((dVar5 - dVar29) * 0.2 + (double)p_Var14);
    }
    while (p_Var14 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                      &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var14 != (_List_node_base *)plVar2) {
      p_Var14[2]._M_prev = p_Var14[5]._M_prev;
      uVar7 = p_Var14[5]._M_next;
      p_Var14[1]._M_prev = p_Var14[4]._M_prev;
      p_Var14[2]._M_next = (_List_node_base *)uVar7;
    }
  }
  return;
}

Assistant:

void MeshResampler::resample(HalfedgeMesh& mesh) {
	// TODO: (meshEdit)
	// Compute the mean edge length.
	double L = 0.0;
	for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
		L += e->length();
	}
	L /= mesh.nEdges();

	// Repeat the four main steps for 5 or 6 iterations
	for (int i = 0; i < 5; i++) {
		// -> Split edges much longer than the target length (being careful about
		//    how the loop is written!)
		int n = mesh.nEdges();
		EdgeIter e = mesh.edgesBegin();
		for (int i = 0; i < n; i++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
			e++;
		}
		/*EdgeIter e_start = mesh.edgesBegin();
		EdgeIter e_end = mesh.edgesEnd();
		for (EdgeIter e = e_start; e != e_end; e++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
		}*/

		// -> Collapse edges much shorter than the target length.  Here we need to
		//    be EXTRA careful about advancing the loop, because many edges may have
		//    been destroyed by a collapse (which ones?)
		e = mesh.edgesBegin();
		//EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		bool keep_going = true;
		while (keep_going){
			if (e->length() < 4.0*L / 5.0) {
				HalfedgeIter halfedge1 = e->halfedge();
				HalfedgeIter halfedge2 = e->halfedge()->twin();
				EdgeIter deleted_edge_1 = halfedge1->next()->next()->edge();
				EdgeIter deleted_edge_2 = halfedge2->next()->next()->edge();

				e_next = e;
				e_next++;
				while (e_next == deleted_edge_1 || e_next == deleted_edge_2) e_next++;
				if (e_next == mesh.edgesEnd()) keep_going = false;
				mesh.collapseEdge(e);
				e = e_next;
			}
			else {
				e++;
				if (e == mesh.edgesEnd()) keep_going = false;
			}
		}

		/*vector<EdgeIter> buffer;
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			if (e->length() < 4.0*L / 5.0) buffer.push_back(e); 
		}
		for (EdgeIter e: buffer) mesh.collapseEdge(e);*/

		/*EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		for (int i = 0; i < mesh.nEdges();i++) {
			e_next++;
			if (e->length() < 4.0*L / 5.0) mesh.collapseEdge(e);
			e = e_next;
		}*/

		// -> Now flip each edge if it improves vertex degree
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			int a1 = e->halfedge()->vertex()->degree();
			int a2 = e->halfedge()->twin()->vertex()->degree();
			int b1 = e->halfedge()->next()->next()->vertex()->degree();
			int b2 = e->halfedge()->twin()->next()->next()->vertex()->degree();
			int before = abs(a1 - 6) + abs(a2 - 6) + abs(b1 - 6) + abs(b2 - 6);
			int after = abs(a1 - 1 - 6) + abs(a2 - 1 - 6) + abs(b1 + 1 - 6) + abs(b2 + 1 - 6);
			if (after < before) mesh.flipEdge(e);
		}

		// -> Finally, apply some tangential smoothing to the vertex positions
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			double w = 1.0 / 5.0;
			Vector3D N = ver->normal();
			Vector3D c = ver->centroid();
			Vector3D p = ver->position;
			Vector3D v = c - p;
			v = v - dot(N, v);
			ver->newPosition = p + w * v;
		}
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			ver->position = ver->newPosition;
		}

	}
	//showError("resample() not implemented.");
}